

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing-v6_3.c
# Opt level: O0

int can_sjw_check(net_device *dev,can_bittiming *bt,can_bittiming_const *btc,netlink_ext_ack *extack
                 )

{
  netlink_ext_ack *extack_local;
  can_bittiming_const *btc_local;
  can_bittiming *bt_local;
  net_device *dev_local;
  int local_4;
  
  if (btc->sjw_max < bt->sjw) {
    local_4 = -0x16;
  }
  else if (bt->phase_seg1 < bt->sjw) {
    local_4 = -0x16;
  }
  else if (bt->phase_seg2 < bt->sjw) {
    local_4 = -0x16;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int can_sjw_check(const struct net_device *dev, const struct can_bittiming *bt,
		  const struct can_bittiming_const *btc, struct netlink_ext_ack *extack)
{
	if (bt->sjw > btc->sjw_max) {
		NL_SET_ERR_MSG_FMT(extack, "sjw: %u greater than max sjw: %u",
				   bt->sjw, btc->sjw_max);
		return -EINVAL;
	}

	if (bt->sjw > bt->phase_seg1) {
		NL_SET_ERR_MSG_FMT(extack,
				   "sjw: %u greater than phase-seg1: %u",
				   bt->sjw, bt->phase_seg1);
		return -EINVAL;
	}

	if (bt->sjw > bt->phase_seg2) {
		NL_SET_ERR_MSG_FMT(extack,
				   "sjw: %u greater than phase-seg2: %u",
				   bt->sjw, bt->phase_seg2);
		return -EINVAL;
	}

	return 0;
}